

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QByteArray,QRhiGles2::PipelineCacheData>::emplace<QRhiGles2::PipelineCacheData_const&>
          (QHash<QByteArray,_QRhiGles2::PipelineCacheData> *this,QByteArray *key,
          PipelineCacheData *args)

{
  long lVar1;
  bool bVar2;
  QHash<QByteArray,_QRhiGles2::PipelineCacheData> *in_RDX;
  PipelineCacheData *in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  QHash<QByteArray,_QRhiGles2::PipelineCacheData> copy;
  PipelineCacheData *in_stack_ffffffffffffff88;
  PipelineCacheData *in_stack_ffffffffffffff90;
  PipelineCacheData *in_stack_ffffffffffffff98;
  piter local_40;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QHash<QByteArray,_QRhiGles2::PipelineCacheData>::isDetached
                    ((QHash<QByteArray,_QRhiGles2::PipelineCacheData> *)in_stack_ffffffffffffff90);
  if (bVar2) {
    bVar2 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QRhiGles2::PipelineCacheData>_>::
            shouldGrow((Data<QHashPrivate::Node<QByteArray,_QRhiGles2::PipelineCacheData>_> *)
                       (in_RDI->d).d);
    if (bVar2) {
      QRhiGles2::PipelineCacheData::PipelineCacheData
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      local_40 = (piter)QHash<QByteArray,_QRhiGles2::PipelineCacheData>::
                        emplace_helper<QRhiGles2::PipelineCacheData>(in_RDX,in_RDI,in_RSI);
      QRhiGles2::PipelineCacheData::~PipelineCacheData((PipelineCacheData *)0x943e4e);
    }
    else {
      local_40 = (piter)emplace_helper<QRhiGles2::PipelineCacheData_const&>
                                  (in_RDX,in_RDI,in_stack_ffffffffffffff98);
    }
  }
  else {
    QHash<QByteArray,_QRhiGles2::PipelineCacheData>::QHash
              ((QHash<QByteArray,_QRhiGles2::PipelineCacheData> *)in_stack_ffffffffffffff90,
               (QHash<QByteArray,_QRhiGles2::PipelineCacheData> *)in_stack_ffffffffffffff88);
    QHash<QByteArray,_QRhiGles2::PipelineCacheData>::detach
              ((QHash<QByteArray,_QRhiGles2::PipelineCacheData> *)in_stack_ffffffffffffff90);
    local_40 = (piter)emplace_helper<QRhiGles2::PipelineCacheData_const&>
                                (in_RDX,in_RDI,in_stack_ffffffffffffff98);
    QHash<QByteArray,_QRhiGles2::PipelineCacheData>::~QHash
              ((QHash<QByteArray,_QRhiGles2::PipelineCacheData> *)in_stack_ffffffffffffff90);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (iterator)local_40;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }